

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O3

void calcBias<Blob<64>,unsigned_long>
               (pfHash hash,vector<int,_std::allocator<int>_> *counts,int reps,Rand *r,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  int iBit;
  uint32_t bit;
  int iOut;
  uint32_t bit_00;
  Blob<64> K;
  unsigned_long B;
  unsigned_long A;
  undefined8 local_60;
  ulong local_58;
  vector<int,_std::allocator<int>_> *local_50;
  Rand *local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_60 = 0;
  if (0 < reps) {
    uVar4 = 0;
    local_58 = (ulong)(uint)reps / 10;
    local_50 = counts;
    local_48 = r;
    do {
      if ((verbose) && ((int)(uVar4 % (local_58 & 0xffffffff)) == 0)) {
        putchar(0x2e);
      }
      Rand::rand_p(local_48,&local_60,8);
      bit = 0;
      (*hash)(&local_60,8,0,local_38);
      piVar5 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      do {
        flipbit(&local_60,8,bit);
        (*hash)(&local_60,8,0,local_40);
        flipbit(&local_60,8,bit);
        bit_00 = 0;
        do {
          uVar1 = getbit(local_38,8,bit_00);
          uVar2 = getbit(local_40,8,bit_00);
          bit_00 = bit_00 + 1;
          *piVar5 = *piVar5 + (uVar2 ^ uVar1);
          piVar5 = piVar5 + 1;
        } while (bit_00 != 0x40);
        bit = bit + 1;
      } while (bit != 0x40);
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar3 != reps);
  }
  return;
}

Assistant:

void calcBias ( pfHash hash, std::vector<int> & counts, int reps, Rand & r, bool verbose )
{
  const int keybytes = sizeof(keytype);
  const int hashbytes = sizeof(hashtype);

  const int keybits = keybytes * 8;
  const int hashbits = hashbytes * 8;

  keytype K;
  hashtype A,B;

  for(int irep = 0; irep < reps; irep++)
  {
    if(verbose) {
      if(irep % (reps/10) == 0) printf(".");
    }

    r.rand_p(&K,keybytes);

    hash(&K,keybytes,0,&A);

    int * cursor = &counts[0];

    for(int iBit = 0; iBit < keybits; iBit++)
    {
      flipbit(&K,keybytes,iBit);
      hash(&K,keybytes,0,&B);
      flipbit(&K,keybytes,iBit);

      for(int iOut = 0; iOut < hashbits; iOut++)
      {
        int bitA = getbit(&A,hashbytes,iOut);
        int bitB = getbit(&B,hashbytes,iOut);

        (*cursor++) += (bitA ^ bitB);
      }
    }
  }
}